

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void constructor(LexState *ls,expdesc *t)

{
  uint uVar1;
  FuncState *fs_00;
  int iVar2;
  uint uVar3;
  bool bVar4;
  undefined1 local_58 [8];
  ConsControl cc;
  int pc;
  int line;
  FuncState *fs;
  expdesc *t_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  cc._44_4_ = ls->linenumber;
  cc.tostore = luaK_codeABC(fs_00,OP_NEWTABLE,0,0,0);
  cc.nh = 0;
  cc.t._0_4_ = 0;
  cc.t._4_4_ = 0;
  cc.v._16_8_ = t;
  init_exp(t,VRELOCABLE,cc.tostore);
  init_exp((expdesc *)local_58,VVOID,0);
  luaK_exp2nextreg(ls->fs,t);
  checknext(ls,0x7b);
  do {
    if ((ls->t).token == 0x7d) break;
    closelistfield(fs_00,(ConsControl *)local_58);
    field(ls,(ConsControl *)local_58);
    iVar2 = testnext(ls,0x2c);
    bVar4 = true;
    if (iVar2 == 0) {
      iVar2 = testnext(ls,0x3b);
      bVar4 = iVar2 != 0;
    }
  } while (bVar4);
  check_match(ls,0x7d,0x7b,cc._44_4_);
  lastlistfield(fs_00,(ConsControl *)local_58);
  uVar1 = fs_00->f->code[cc.tostore];
  iVar2 = luaO_int2fb(cc.t._4_4_);
  fs_00->f->code[cc.tostore] = uVar1 & 0x7fffff | iVar2 << 0x17;
  uVar1 = fs_00->f->code[cc.tostore];
  uVar3 = luaO_int2fb((uint)cc.t);
  fs_00->f->code[cc.tostore] = uVar1 & 0xff803fff | (uVar3 & 0x1ff) << 0xe;
  return;
}

Assistant:

static void constructor(LexState *ls, expdesc *t) {
    /* constructor -> '{' [ field { sep field } [sep] ] '}'
       sep -> ',' | ';' */
    FuncState *fs = ls->fs;
    int line = ls->linenumber;
    int pc = luaK_codeABC(fs, OP_NEWTABLE, 0, 0, 0);
    struct ConsControl cc;
    cc.na = cc.nh = cc.tostore = 0;
    cc.t = t;
    init_exp(t, VRELOCABLE, pc);
    init_exp(&cc.v, VVOID, 0);  /* no value (yet) */
    luaK_exp2nextreg(ls->fs, t);  /* fix it at stack top */
    checknext(ls, '{');
    do {
        lua_assert(cc.v.k == VVOID || cc.tostore > 0);
        if (ls->t.token == '}') break;
        closelistfield(fs, &cc);
        field(ls, &cc);
    } while (testnext(ls, ',') || testnext(ls, ';'));
    check_match(ls, '}', '{', line);
    lastlistfield(fs, &cc);
    SETARG_B(fs->f->code[pc], luaO_int2fb(cc.na)); /* set initial array size */
    SETARG_C(fs->f->code[pc], luaO_int2fb(cc.nh));  /* set initial table size */
}